

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_errcode(sqlite3 *db)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 7;
  if (db != (sqlite3 *)0x0) {
    iVar1 = sqlite3SafetyCheckSickOrOk(db);
    if (iVar1 == 0) {
      iVar1 = sqlite3MisuseError(0x2abe3);
      return iVar1;
    }
    if (db->mallocFailed == '\0') {
      uVar2 = db->errMask & db->errCode;
    }
  }
  return uVar2;
}

Assistant:

SQLITE_API int sqlite3_errcode(sqlite3 *db){
  if( db && !sqlite3SafetyCheckSickOrOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  if( !db || db->mallocFailed ){
    return SQLITE_NOMEM_BKPT;
  }
  return db->errCode & db->errMask;
}